

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O3

void __thiscall
Imf_2_5::SimdAlignedBuffer64<unsigned_short>::alloc(SimdAlignedBuffer64<unsigned_short> *this)

{
  int iVar1;
  unsigned_short *puVar2;
  void *ptr;
  unsigned_short *local_20;
  
  local_20 = (unsigned_short *)0x0;
  iVar1 = posix_memalign(&local_20,0x20,0x80);
  puVar2 = (unsigned_short *)0x0;
  if (iVar1 == 0) {
    puVar2 = local_20;
  }
  this->_handle = (char *)puVar2;
  if (((ulong)puVar2 & 0x1f) != 0) {
    free(puVar2);
    local_20 = (unsigned_short *)0x0;
    iVar1 = posix_memalign(&local_20,0x20,0xa0);
    puVar2 = (unsigned_short *)0x0;
    if (iVar1 == 0) {
      puVar2 = local_20;
    }
    this->_handle = (char *)puVar2;
    puVar2 = (unsigned_short *)((long)puVar2 + (ulong)(-(int)puVar2 & 0x1f));
  }
  this->_buffer = puVar2;
  return;
}

Assistant:

void alloc()
        {
            //
            // Try EXRAllocAligned first - but it might fallback to
            // unaligned allocs. If so, overalloc.
            //

            _handle = (char *) EXRAllocAligned
                (64 * sizeof(T), _SSE_ALIGNMENT);

            if (((size_t)_handle & (_SSE_ALIGNMENT - 1)) == 0)
            {
                _buffer = (T *)_handle;
                return;
            }

            EXRFreeAligned(_handle);
            _handle = (char *) EXRAllocAligned
                (64 * sizeof(T) + _SSE_ALIGNMENT, _SSE_ALIGNMENT);

            char *aligned = _handle;

            while ((size_t)aligned & (_SSE_ALIGNMENT - 1))
                aligned++;

            _buffer = (T *)aligned;    
        }